

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateSetIntegerProperty
               (HelicsFederate fed,int intProperty,int propVal,HelicsError *err)

{
  element_type *peVar1;
  FedObject *pFVar2;
  
  pFVar2 = helics::getFedObject(fed,err);
  if ((pFVar2 != (FedObject *)0x0) &&
     (peVar1 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, peVar1 != (element_type *)0x0)) {
    (*peVar1->_vptr_Federate[6])(peVar1,(ulong)(uint)intProperty,(ulong)(uint)propVal);
  }
  return;
}

Assistant:

void helicsFederateSetIntegerProperty(HelicsFederate fed, int intProperty, int propVal, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->setProperty(intProperty, propVal);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}